

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlogin.c
# Opt level: O0

void rlogin_free(Backend *be)

{
  _Bool _Var1;
  Interactor **ptr;
  Rlogin *rlogin;
  Backend *be_local;
  
  ptr = &be[-6].interactor;
  _Var1 = is_tempseat((Seat *)be[-4].interactor);
  if (_Var1) {
    tempseat_free((Seat *)be[-4].interactor);
  }
  if (be[-1].vt != (BackendVtable *)0x0) {
    free_prompts((prompts_t *)be[-1].vt);
  }
  if (*ptr != (Interactor *)0x0) {
    sk_close((Socket *)*ptr);
  }
  conf_free((Conf *)be[-2].interactor);
  safefree(be[-2].vt);
  safefree(ptr);
  return;
}

Assistant:

static void rlogin_free(Backend *be)
{
    Rlogin *rlogin = container_of(be, Rlogin, backend);

    if (is_tempseat(rlogin->seat))
        tempseat_free(rlogin->seat);
    if (rlogin->prompt)
        free_prompts(rlogin->prompt);
    if (rlogin->s)
        sk_close(rlogin->s);
    conf_free(rlogin->conf);
    sfree(rlogin->description);
    sfree(rlogin);
}